

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O1

size_t value_type_count(void *v)

{
  type_id tVar1;
  size_t sVar2;
  
  tVar1 = value_type_id(v);
  if (tVar1 - 9U < 2) {
    sVar2 = value_size(v);
    sVar2 = sVar2 - 4 >> 3;
  }
  else {
    sVar2 = (size_t)(tVar1 != 0x14);
  }
  return sVar2;
}

Assistant:

size_t value_type_count(void *v)
{
	const type_id id = value_type_id(v);

	if (id == TYPE_ARRAY || id == TYPE_MAP)
	{
		/* Array and map can contain multiple values */
		return value_type_size(v) / sizeof(const value);
	}
	else if (id == TYPE_INVALID)
	{
		/* Invalid does not contain any value */
		return 0;
	}

	/* Rest of values only can contain one value */
	return 1;
}